

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<unsigned_char> __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_char>::tryAllocate
          (HoleSet<unsigned_char> *this,uchar lgSize)

{
  size_t sVar1;
  NullableValue<unsigned_char> *other;
  uchar *puVar2;
  byte in_DL;
  undefined7 in_register_00000031;
  uchar (*arr) [6];
  uchar local_39;
  uchar *puStack_38;
  uchar result_1;
  uchar *next;
  undefined1 local_1f [4];
  uchar local_1b [2];
  byte local_19;
  NullableValue<unsigned_char> _next90;
  uchar result;
  uchar (*pauStack_18) [6];
  uchar lgSize_local;
  HoleSet<unsigned_char> *this_local;
  
  arr = (uchar (*) [6])CONCAT71(in_register_00000031,lgSize);
  local_19 = in_DL;
  pauStack_18 = arr;
  sVar1 = kj::size<unsigned_char,6ul>(arr);
  if (in_DL < sVar1) {
    if ((*arr)[local_19] == '\0') {
      tryAllocate((HoleSet<unsigned_char> *)local_1f,lgSize);
      other = kj::_::readMaybe<unsigned_char>((Maybe<unsigned_char> *)local_1f);
      kj::_::NullableValue<unsigned_char>::NullableValue
                ((NullableValue<unsigned_char> *)(local_1f + 2),other);
      kj::Maybe<unsigned_char>::~Maybe((Maybe<unsigned_char> *)local_1f);
      puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_char_
                         ((NullableValue *)(local_1f + 2));
      if (puVar2 == (uchar *)0x0) {
        kj::Maybe<unsigned_char>::Maybe((Maybe<unsigned_char> *)this);
      }
      else {
        puStack_38 = kj::_::NullableValue<unsigned_char>::operator*
                               ((NullableValue<unsigned_char> *)(local_1f + 2));
        local_39 = *puStack_38 * '\x02';
        (*arr)[local_19] = local_39 + '\x01';
        kj::Maybe<unsigned_char>::Maybe((Maybe<unsigned_char> *)this,&local_39);
      }
      kj::_::NullableValue<unsigned_char>::~NullableValue
                ((NullableValue<unsigned_char> *)(local_1f + 2));
    }
    else {
      local_1b[0] = (*arr)[local_19];
      (*arr)[local_19] = '\0';
      kj::Maybe<unsigned_char>::Maybe((Maybe<unsigned_char> *)this,local_1b);
    }
  }
  else {
    kj::Maybe<unsigned_char>::Maybe((Maybe<unsigned_char> *)this);
  }
  return (Maybe<unsigned_char>)SUB82(this,0);
}

Assistant:

kj::Maybe<UIntType> tryAllocate(UIntType lgSize) {
      // Try to find space for a field of size 2^lgSize within the set of holes.  If found,
      // remove it from the holes, and return its offset (as a multiple of its size).  If there
      // is no such space, returns zero (no hole can be at offset zero, as explained above).

      if (lgSize >= kj::size(holes)) {
        return kj::none;
      } else if (holes[lgSize] != 0) {
        UIntType result = holes[lgSize];
        holes[lgSize] = 0;
        return result;
      } else {
        KJ_IF_SOME(next, tryAllocate(lgSize + 1)) {
          UIntType result = next * 2;
          holes[lgSize] = result + 1;
          return result;
        } else {
          return kj::none;
        }
      }